

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

QGraphicsItem * __thiscall
QGraphicsItem::commonAncestorItem(QGraphicsItem *this,QGraphicsItem *other)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  if (other == (QGraphicsItem *)0x0) {
    this = (QGraphicsItem *)0x0;
  }
  else if (other != this) {
    iVar1 = QGraphicsItemPrivate::depth((this->d_ptr).d);
    iVar2 = QGraphicsItemPrivate::depth((other->d_ptr).d);
    for (iVar3 = iVar1; iVar2 < iVar3; iVar3 = iVar3 + -1) {
      this = ((this->d_ptr).d)->parent;
    }
    iVar3 = iVar2;
    if (iVar1 < iVar2) {
      iVar3 = iVar1;
    }
    for (; iVar3 < iVar2; iVar2 = iVar2 + -1) {
      other = ((other->d_ptr).d)->parent;
    }
    for (; (this != (QGraphicsItem *)0x0 && (this != other)); this = ((this->d_ptr).d)->parent) {
      other = ((other->d_ptr).d)->parent;
    }
  }
  return this;
}

Assistant:

QGraphicsItem *QGraphicsItem::commonAncestorItem(const QGraphicsItem *other) const
{
    if (!other)
        return nullptr;
    if (other == this)
        return const_cast<QGraphicsItem *>(this);
    const QGraphicsItem *thisw = this;
    const QGraphicsItem *otherw = other;
    int thisDepth = d_ptr->depth();
    int otherDepth = other->d_ptr->depth();
    while (thisDepth > otherDepth) {
        thisw = thisw->d_ptr->parent;
        --thisDepth;
    }
    while (otherDepth > thisDepth) {
        otherw = otherw->d_ptr->parent;
        --otherDepth;
    }
    while (thisw && thisw != otherw) {
        thisw = thisw->d_ptr->parent;
        otherw = otherw->d_ptr->parent;
    }
    return const_cast<QGraphicsItem *>(thisw);
}